

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlParserErrors
xmlParseBalancedChunkMemoryInternal
          (xmlParserCtxtPtr oldctxt,xmlChar *string,void *user_data,xmlNodePtr *lst)

{
  xmlChar xVar1;
  xmlDictPtr pxVar2;
  _xmlSAXHandler *p_Var3;
  xmlHashTablePtr pxVar4;
  int iVar5;
  uint uVar6;
  xmlParserCtxtPtr ctxt;
  xmlChar *pxVar7;
  xmlDocPtr cur;
  xmlNodePtr cur_00;
  xmlDocPtr pxVar8;
  xmlParserErrors xVar9;
  _xmlNode *p_Var10;
  long lVar11;
  _xmlNode *local_48;
  _xmlNode *p_Stack_40;
  
  if (0x28 < oldctxt->depth) {
    if (0x400 < (uint)oldctxt->depth) {
      return XML_ERR_ENTITY_LOOP;
    }
    if ((oldctxt->options & 0x80000U) == 0) {
      return XML_ERR_ENTITY_LOOP;
    }
  }
  if (lst != (xmlNodePtr *)0x0) {
    *lst = (xmlNodePtr)0x0;
  }
  xVar9 = XML_ERR_INTERNAL_ERROR;
  if (string == (xmlChar *)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  iVar5 = xmlStrlen(string);
  ctxt = xmlCreateMemoryParserCtxt((char *)string,iVar5);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return XML_WAR_UNDECLARED_ENTITY;
  }
  if (user_data == (void *)0x0) {
    user_data = ctxt;
  }
  ctxt->userData = user_data;
  if (ctxt->dict != (xmlDictPtr)0x0) {
    xmlDictFree(ctxt->dict);
  }
  pxVar2 = oldctxt->dict;
  ctxt->dict = pxVar2;
  ctxt->input_id = oldctxt->input_id + 1;
  pxVar7 = xmlDictLookup(pxVar2,"xml",3);
  ctxt->str_xml = pxVar7;
  pxVar7 = xmlDictLookup(ctxt->dict,"xmlns",5);
  ctxt->str_xmlns = pxVar7;
  pxVar7 = xmlDictLookup(ctxt->dict,(xmlChar *)"http://www.w3.org/XML/1998/namespace",0x24);
  ctxt->str_xml_ns = pxVar7;
  iVar5 = oldctxt->curly;
  ctxt->mlType = oldctxt->mlType;
  ctxt->curly = iVar5;
  ctxt->quoted = oldctxt->quoted;
  for (lVar11 = 0; lVar11 < oldctxt->nsNr; lVar11 = lVar11 + 2) {
    nsPush(ctxt,oldctxt->nsTab[lVar11],oldctxt->nsTab[lVar11 + 1]);
  }
  p_Var3 = ctxt->sax;
  ctxt->sax = oldctxt->sax;
  xmlDetectSAX2(ctxt);
  ctxt->replaceEntities = oldctxt->replaceEntities;
  ctxt->options = oldctxt->options;
  ctxt->_private = oldctxt->_private;
  pxVar8 = oldctxt->myDoc;
  if (pxVar8 == (xmlDocPtr)0x0) {
    cur = xmlNewDoc("1.0");
    if (cur == (xmlDocPtr)0x0) {
      ctxt->sax = p_Var3;
      ctxt->dict = (xmlDictPtr)0x0;
      xmlFreeParserCtxt(ctxt);
      return XML_ERR_INTERNAL_ERROR;
    }
    cur->properties = 0x40;
    pxVar2 = ctxt->dict;
    cur->dict = pxVar2;
    xmlDictReference(pxVar2);
    ctxt->myDoc = cur;
    local_48 = (_xmlNode *)0x0;
    p_Stack_40 = (_xmlNode *)0x0;
    pxVar8 = cur;
  }
  else {
    ctxt->myDoc = pxVar8;
    local_48 = pxVar8->children;
    p_Stack_40 = pxVar8->last;
    cur = (xmlDocPtr)0x0;
  }
  cur_00 = xmlNewDocNode(pxVar8,(xmlNsPtr)0x0,(xmlChar *)"pseudoroot",(xmlChar *)0x0);
  if (cur_00 == (xmlNodePtr)0x0) {
    ctxt->sax = p_Var3;
    ctxt->dict = (xmlDictPtr)0x0;
    goto LAB_0016222a;
  }
  pxVar8 = ctxt->myDoc;
  pxVar8->children = (_xmlNode *)0x0;
  pxVar8->last = (_xmlNode *)0x0;
  xmlAddChild((xmlNodePtr)pxVar8,cur_00);
  nodePush(ctxt,ctxt->myDoc->children);
  ctxt->instate = XML_PARSER_CONTENT;
  ctxt->depth = oldctxt->depth + 1;
  ctxt->validate = 0;
  uVar6 = oldctxt->loadsubset;
  ctxt->loadsubset = uVar6;
  if ((oldctxt->validate != 0) || (oldctxt->replaceEntities != 0)) {
    ctxt->loadsubset = uVar6 | 8;
  }
  ctxt->dictNames = oldctxt->dictNames;
  pxVar4 = oldctxt->attsSpecial;
  ctxt->attsDefault = oldctxt->attsDefault;
  ctxt->attsSpecial = pxVar4;
  xmlParseContent(ctxt);
  pxVar7 = ctxt->input->cur;
  xVar1 = *pxVar7;
  if (xVar1 != '\0') {
    if ((xVar1 == '<') && (pxVar7[1] == '/')) {
      xVar9 = XML_ERR_NOT_WELL_BALANCED;
    }
    else {
      xVar9 = XML_ERR_EXTRA_CONTENT;
    }
    xmlFatalErr(ctxt,xVar9,(char *)0x0);
  }
  if (ctxt->node != ctxt->myDoc->children) {
    xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
  }
  if (ctxt->wellFormed == 0) {
    xVar9 = ctxt->errNo + (uint)(ctxt->errNo == 0);
    pxVar8 = ctxt->myDoc;
LAB_001621c3:
    if (pxVar8 != (xmlDocPtr)0x0) {
      p_Var10 = pxVar8->children;
      goto LAB_001621cc;
    }
  }
  else {
    pxVar8 = ctxt->myDoc;
    if (lst == (xmlNodePtr *)0x0) {
      xVar9 = XML_ERR_OK;
      goto LAB_001621c3;
    }
    p_Var10 = pxVar8->children->children;
    *lst = p_Var10;
    for (; p_Var10 != (xmlNodePtr)0x0; p_Var10 = p_Var10->next) {
      if ((((oldctxt->validate != 0) && (oldctxt->wellFormed != 0)) &&
          (pxVar8 = oldctxt->myDoc, pxVar8 != (xmlDocPtr)0x0)) &&
         ((pxVar8->intSubset != (_xmlDtd *)0x0 && (p_Var10->type == XML_ELEMENT_NODE)))) {
        uVar6 = xmlValidateElement(&oldctxt->vctxt,pxVar8,p_Var10);
        oldctxt->valid = oldctxt->valid & uVar6;
      }
      p_Var10->parent = (_xmlNode *)0x0;
    }
    p_Var10 = ctxt->myDoc->children;
    p_Var10->children = (_xmlNode *)0x0;
    xVar9 = XML_ERR_OK;
LAB_001621cc:
    xmlFreeNode(p_Var10);
    pxVar8 = ctxt->myDoc;
    pxVar8->children = local_48;
    pxVar8->last = p_Stack_40;
  }
  oldctxt->nbentities = oldctxt->nbentities + ctxt->nbentities;
  if ((ctxt->lastError).code != 0) {
    xmlCopyError(&ctxt->lastError,&oldctxt->lastError);
  }
  ctxt->sax = p_Var3;
  ctxt->dict = (xmlDictPtr)0x0;
  ctxt->attsDefault = (xmlHashTablePtr)0x0;
  ctxt->attsSpecial = (xmlHashTablePtr)0x0;
LAB_0016222a:
  xmlFreeParserCtxt(ctxt);
  if (cur != (xmlDocPtr)0x0) {
    xmlFreeDoc(cur);
  }
  return xVar9;
}

Assistant:

static xmlParserErrors
xmlParseBalancedChunkMemoryInternal(xmlParserCtxtPtr oldctxt,
	const xmlChar *string, void *user_data, xmlNodePtr *lst) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr newDoc = NULL;
    xmlNodePtr newRoot;
    xmlSAXHandlerPtr oldsax = NULL;
    xmlNodePtr content = NULL;
    xmlNodePtr last = NULL;
    int size;
    xmlParserErrors ret = XML_ERR_OK;
#ifdef SAX2
    int i;
#endif

    if (((oldctxt->depth > 40) && ((oldctxt->options & XML_PARSE_HUGE) == 0)) ||
        (oldctxt->depth >  1024)) {
	return(XML_ERR_ENTITY_LOOP);
    }


    if (lst != NULL)
        *lst = NULL;
    if (string == NULL)
        return(XML_ERR_INTERNAL_ERROR);

    size = xmlStrlen(string);

    ctxt = xmlCreateMemoryParserCtxt((char *) string, size);
    if (ctxt == NULL) return(XML_WAR_UNDECLARED_ENTITY);
    if (user_data != NULL)
	ctxt->userData = user_data;
    else
	ctxt->userData = ctxt;
    if (ctxt->dict != NULL) xmlDictFree(ctxt->dict);
    ctxt->dict = oldctxt->dict;
    ctxt->input_id = oldctxt->input_id + 1;
    ctxt->str_xml = xmlDictLookup(ctxt->dict, BAD_CAST "xml", 3);
    ctxt->str_xmlns = xmlDictLookup(ctxt->dict, BAD_CAST "xmlns", 5);
    ctxt->str_xml_ns = xmlDictLookup(ctxt->dict, XML_XML_NAMESPACE, 36);
    ctxt->mlType = oldctxt->mlType;	/* SML support */
    ctxt->curly = oldctxt->curly;	/* SML support */
    ctxt->quoted = oldctxt->quoted;	/* SML support */

#ifdef SAX2
    /* propagate namespaces down the entity */
    for (i = 0;i < oldctxt->nsNr;i += 2) {
        nsPush(ctxt, oldctxt->nsTab[i], oldctxt->nsTab[i+1]);
    }
#endif

    oldsax = ctxt->sax;
    ctxt->sax = oldctxt->sax;
    xmlDetectSAX2(ctxt);
    ctxt->replaceEntities = oldctxt->replaceEntities;
    ctxt->options = oldctxt->options;

    ctxt->_private = oldctxt->_private;
    if (oldctxt->myDoc == NULL) {
	newDoc = xmlNewDoc(BAD_CAST "1.0");
	if (newDoc == NULL) {
	    ctxt->sax = oldsax;
	    ctxt->dict = NULL;
	    xmlFreeParserCtxt(ctxt);
	    return(XML_ERR_INTERNAL_ERROR);
	}
	newDoc->properties = XML_DOC_INTERNAL;
	newDoc->dict = ctxt->dict;
	xmlDictReference(newDoc->dict);
	ctxt->myDoc = newDoc;
    } else {
	ctxt->myDoc = oldctxt->myDoc;
        content = ctxt->myDoc->children;
	last = ctxt->myDoc->last;
    }
    newRoot = xmlNewDocNode(ctxt->myDoc, NULL, BAD_CAST "pseudoroot", NULL);
    if (newRoot == NULL) {
	ctxt->sax = oldsax;
	ctxt->dict = NULL;
	xmlFreeParserCtxt(ctxt);
	if (newDoc != NULL) {
	    xmlFreeDoc(newDoc);
	}
	return(XML_ERR_INTERNAL_ERROR);
    }
    ctxt->myDoc->children = NULL;
    ctxt->myDoc->last = NULL;
    xmlAddChild((xmlNodePtr) ctxt->myDoc, newRoot);
    nodePush(ctxt, ctxt->myDoc->children);
    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->depth = oldctxt->depth + 1;

    ctxt->validate = 0;
    ctxt->loadsubset = oldctxt->loadsubset;
    if ((oldctxt->validate) || (oldctxt->replaceEntities != 0)) {
	/*
	 * ID/IDREF registration will be done in xmlValidateElement below
	 */
	ctxt->loadsubset |= XML_SKIP_IDS;
    }
    ctxt->dictNames = oldctxt->dictNames;
    ctxt->attsDefault = oldctxt->attsDefault;
    ctxt->attsSpecial = oldctxt->attsSpecial;

    xmlParseContent(ctxt);
    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if (ctxt->node != ctxt->myDoc->children) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = XML_ERR_INTERNAL_ERROR;
	else
	    ret = (xmlParserErrors)ctxt->errNo;
    } else {
      ret = XML_ERR_OK;
    }

    if ((lst != NULL) && (ret == XML_ERR_OK)) {
	xmlNodePtr cur;

	/*
	 * Return the newly created nodeset after unlinking it from
	 * they pseudo parent.
	 */
	cur = ctxt->myDoc->children->children;
	*lst = cur;
	while (cur != NULL) {
#ifdef LIBXML_VALID_ENABLED
	    if ((oldctxt->validate) && (oldctxt->wellFormed) &&
		(oldctxt->myDoc) && (oldctxt->myDoc->intSubset) &&
		(cur->type == XML_ELEMENT_NODE)) {
		oldctxt->valid &= xmlValidateElement(&oldctxt->vctxt,
			oldctxt->myDoc, cur);
	    }
#endif /* LIBXML_VALID_ENABLED */
	    cur->parent = NULL;
	    cur = cur->next;
	}
	ctxt->myDoc->children->children = NULL;
    }
    if (ctxt->myDoc != NULL) {
	xmlFreeNode(ctxt->myDoc->children);
        ctxt->myDoc->children = content;
        ctxt->myDoc->last = last;
    }

    /*
     * Record in the parent context the number of entities replacement
     * done when parsing that reference.
     */
    if (oldctxt != NULL)
        oldctxt->nbentities += ctxt->nbentities;

    /*
     * Also record the last error if any
     */
    if (ctxt->lastError.code != XML_ERR_OK)
        xmlCopyError(&ctxt->lastError, &oldctxt->lastError);

    ctxt->sax = oldsax;
    ctxt->dict = NULL;
    ctxt->attsDefault = NULL;
    ctxt->attsSpecial = NULL;
    xmlFreeParserCtxt(ctxt);
    if (newDoc != NULL) {
	xmlFreeDoc(newDoc);
    }

    return(ret);
}